

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O0

string * __thiscall
GeneratorExpressionContent::Evaluate_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference ppcVar4;
  string local_1a8;
  undefined1 local_188 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  undefined1 local_150 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  allocator local_d1;
  string local_d0;
  string local_b0;
  cmGeneratorExpressionNode *local_90;
  cmGeneratorExpressionNode *node;
  string local_78 [32];
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_58;
  const_iterator end;
  const_iterator it;
  string identifier;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorExpressionContext *context_local;
  GeneratorExpressionContent *this_local;
  
  std::__cxx11::string::string((string *)&it);
  end = std::
        vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
        ::begin(&this->IdentifierChildren);
  local_58._M_current =
       (cmGeneratorExpressionEvaluator **)
       std::
       vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>::
       end(&this->IdentifierChildren);
  do {
    bVar1 = __gnu_cxx::operator!=(&end,&local_58);
    if (!bVar1) {
      local_90 = cmGeneratorExpressionNode::GetNode((string *)&it);
      if (local_90 == (cmGeneratorExpressionNode *)0x0) {
        GetOriginalExpression_abi_cxx11_(&local_b0,this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_d0,"Expression did not evaluate to a known generator expression"
                   ,&local_d1);
        reportError(context,&local_b0,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        node._0_4_ = 1;
      }
      else {
        uVar2 = (*local_90->_vptr_cmGeneratorExpressionNode[2])();
        if ((uVar2 & 1) == 0) {
          iVar3 = (*local_90->_vptr_cmGeneratorExpressionNode[5])();
          if ((iVar3 == 1) &&
             (uVar2 = (*local_90->_vptr_cmGeneratorExpressionNode[4])(), (uVar2 & 1) != 0)) {
            bVar1 = std::
                    vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                    ::empty(&this->ParamChildren);
            if (bVar1) {
              GetOriginalExpression_abi_cxx11_(&local_f8,this);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &parameters_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"$<",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &it);
              std::operator+(&local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &parameters_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "> expression requires a parameter.");
              reportError(context,&local_f8,&local_118);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string
                        ((string *)
                         &parameters_1.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string((string *)&local_f8);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_150);
            EvaluateParameters((string *)
                               &parameters.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,this,local_90,
                               (string *)&it,context,dagChecker,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_150);
            std::__cxx11::string::~string
                      ((string *)
                       &parameters.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_150);
          }
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          node._0_4_ = 1;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_188);
          EvaluateParameters(&local_1a8,this,local_90,(string *)&it,context,dagChecker,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_188);
          std::__cxx11::string::~string((string *)&local_1a8);
          if ((context->HadError & 1U) == 0) {
            (*local_90->_vptr_cmGeneratorExpressionNode[6])
                      (__return_storage_ptr__,local_90,local_188,context,this,dagChecker);
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__);
          }
          node._0_4_ = 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_188);
        }
      }
LAB_005ed8d3:
      std::__cxx11::string::~string((string *)&it);
      return __return_storage_ptr__;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&end);
    (*(*ppcVar4)->_vptr_cmGeneratorExpressionEvaluator[3])(local_78,*ppcVar4,context,dagChecker);
    std::__cxx11::string::operator+=((string *)&it,local_78);
    std::__cxx11::string::~string(local_78);
    if ((context->HadError & 1U) != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      node._0_4_ = 1;
      goto LAB_005ed8d3;
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

std::string GeneratorExpressionContent::Evaluate(
                            cmGeneratorExpressionContext *context,
                            cmGeneratorExpressionDAGChecker *dagChecker) const
{
  std::string identifier;
  {
  std::vector<cmGeneratorExpressionEvaluator*>::const_iterator it
                                          = this->IdentifierChildren.begin();
  const std::vector<cmGeneratorExpressionEvaluator*>::const_iterator end
                                          = this->IdentifierChildren.end();
  for ( ; it != end; ++it)
    {
    identifier += (*it)->Evaluate(context, dagChecker);
    if (context->HadError)
      {
      return std::string();
      }
    }
  }

  const cmGeneratorExpressionNode *node =
      cmGeneratorExpressionNode::GetNode(identifier);

  if (!node)
    {
    reportError(context, this->GetOriginalExpression(),
              "Expression did not evaluate to a known generator expression");
    return std::string();
    }

  if (!node->GeneratesContent())
    {
    if (node->NumExpectedParameters() == 1
        && node->AcceptsArbitraryContentParameter())
      {
      if (this->ParamChildren.empty())
        {
        reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires a parameter.");
        }
      }
    else
      {
      std::vector<std::string> parameters;
      this->EvaluateParameters(node, identifier, context, dagChecker,
                               parameters);
      }
    return std::string();
    }

  std::vector<std::string> parameters;
  this->EvaluateParameters(node, identifier, context, dagChecker, parameters);
  if (context->HadError)
    {
    return std::string();
    }

  return node->Evaluate(parameters, context, this, dagChecker);
}